

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::ensureRowwise(HighsSparseMatrix *this)

{
  int iVar1;
  bool bVar2;
  value_type vVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  HighsSparseMatrix *in_RDI;
  HighsInt iRow_2;
  HighsInt iRow_el;
  HighsInt iRow_1;
  HighsInt iEl_1;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt iEl;
  vector<int,_std::allocator<int>_> ARlength;
  vector<double,_std::allocator<double>_> Avalue;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  HighsInt num_nz;
  HighsInt num_row;
  HighsInt num_col;
  HighsSparseMatrix *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_a8;
  int local_9c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar7;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vector<int,_std::allocator<int>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  vector<int,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> local_30;
  undefined4 local_18;
  HighsInt local_14;
  HighsInt local_10;
  HighsInt local_c;
  
  bVar2 = isRowwise(in_RDI);
  if (!bVar2) {
    local_c = in_RDI->num_col_;
    local_10 = in_RDI->num_row_;
    local_14 = numNz(in_stack_ffffffffffffff18);
    if (local_14 == 0) {
      local_18 = 0;
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (size_type)in_stack_ffffffffffffff18,(value_type_conflict2 *)0x7e6569);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x7e6577);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x7e6585);
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e6628);
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (size_type)in_stack_ffffffffffffff18,(value_type_conflict2 *)0x7e6647);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,0);
      for (vVar3 = *pvVar5; vVar3 < local_14; vVar3 = vVar3 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)vVar3);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)*pvVar5);
        *pvVar5 = *pvVar5 + 1;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,0);
      *pvVar5 = 0;
      for (iVar7 = 0; iVar7 < local_10; iVar7 = iVar7 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)iVar7);
        vVar3 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)iVar7);
        iVar4 = vVar3 + *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->start_,(long)(iVar7 + 1));
        *pvVar5 = iVar4;
      }
      for (iVar7 = 0; iVar7 < local_c; iVar7 = iVar7 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)iVar7);
        local_9c = *pvVar5;
        while (iVar4 = local_9c,
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_30,(long)(iVar7 + 1)), iVar4 < *pvVar5) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_9c);
          iVar4 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)iVar4);
          iVar1 = *pvVar5;
          vVar3 = iVar7;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)iVar1);
          *pvVar5 = iVar7;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_70,(long)local_9c);
          in_stack_ffffffffffffff30 = (vector<double,_std::allocator<double>_> *)*pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)iVar1);
          *pvVar6 = (value_type)in_stack_ffffffffffffff30;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)iVar4);
          *pvVar5 = *pvVar5 + 1;
          local_9c = local_9c + 1;
          iVar7 = vVar3;
        }
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,0);
      *pvVar5 = 0;
      for (local_a8 = 0; local_a8 < local_10; local_a8 = local_a8 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_a8);
        vVar3 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)local_a8);
        iVar7 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->start_,(long)(local_a8 + 1));
        *pvVar5 = vVar3 + iVar7;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
    }
    in_RDI->format_ = kRowwise;
    numNz(in_stack_ffffffffffffff18);
  }
  return;
}

Assistant:

void HighsSparseMatrix::ensureRowwise() {
  assert(this->formatOk());
  if (this->isRowwise()) return;
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  assert(num_nz >= 0);
  assert((HighsInt)this->index_.size() >= num_nz);
  assert((HighsInt)this->value_.size() >= num_nz);
  if (num_nz == 0) {
    // Empty matrix, so just ensure that there are enough zero starts
    // for the new orientation
    this->start_.assign(num_row + 1, 0);
    this->index_.clear();
    this->value_.clear();
  } else {
    // Matrix is non-empty, so transpose it
    //
    // Take a copy of the current matrix - that is colwise - so that
    // the current matrix is filled rowwise
    vector<HighsInt> Astart = this->start_;
    vector<HighsInt> Aindex = this->index_;
    vector<double> Avalue = this->value_;
    this->start_.resize(num_row + 1);
    this->index_.resize(num_nz);
    this->value_.resize(num_nz);
    vector<HighsInt> ARlength;
    ARlength.assign(num_row, 0);
    for (HighsInt iEl = Astart[0]; iEl < num_nz; iEl++) ARlength[Aindex[iEl]]++;
    this->start_[0] = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      this->start_[iRow + 1] = this->start_[iRow] + ARlength[iRow];
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      for (HighsInt iEl = Astart[iCol]; iEl < Astart[iCol + 1]; iEl++) {
        HighsInt iRow = Aindex[iEl];
        HighsInt iRow_el = this->start_[iRow];
        this->index_[iRow_el] = iCol;
        this->value_[iRow_el] = Avalue[iEl];
        this->start_[iRow]++;
      }
    }
    this->start_[0] = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      this->start_[iRow + 1] = this->start_[iRow] + ARlength[iRow];
    assert(this->start_[num_row] == num_nz);
  }
  this->format_ = MatrixFormat::kRowwise;
  assert((HighsInt)this->start_.size() >= num_row + 1);
  num_nz = this->numNz();
  assert(num_nz >= 0);
  assert((HighsInt)this->index_.size() >= num_nz);
  assert((HighsInt)this->value_.size() >= num_nz);
}